

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boolean.c
# Opt level: O1

BoolExprType eval_bool_expr(BoolExpr *be)

{
  BoolExprType BVar1;
  BoolExprType BVar2;
  BoolExprStruct *pBVar3;
  
  BVar2 = be->type;
  switch(be->type) {
  case E_FALSE:
  case E_TRUE:
    break;
  default:
    BVar2 = E_UNKNOWN;
    break;
  case E_AND:
    BVar2 = E_TRUE;
    for (pBVar3 = be->subexpr; pBVar3 != (BoolExpr *)0x0; pBVar3 = pBVar3->next) {
      BVar1 = eval_bool_expr(pBVar3);
      if (BVar1 == E_UNKNOWN) {
        BVar2 = E_UNKNOWN;
      }
      else if (BVar1 == E_FALSE) {
        return E_FALSE;
      }
    }
    break;
  case E_OR:
    BVar2 = E_FALSE;
    for (pBVar3 = be->subexpr; pBVar3 != (BoolExpr *)0x0; pBVar3 = pBVar3->next) {
      BVar1 = eval_bool_expr(pBVar3);
      if (BVar1 == E_UNKNOWN) {
        BVar2 = E_UNKNOWN;
      }
      else if (BVar1 == E_TRUE) {
        return E_TRUE;
      }
    }
    break;
  case E_NOT:
    BVar1 = eval_bool_expr(be->subexpr);
    BVar2 = E_FALSE;
    if (BVar1 != E_TRUE) {
      BVar2 = E_UNKNOWN - (BVar1 == E_FALSE);
    }
  }
  return BVar2;
}

Assistant:

BoolExprType
eval_bool_expr (const BoolExpr *be)
{
  BoolExprType deflt;

  switch (be->type) {
  case E_TRUE:  return E_TRUE;
  case E_FALSE: return E_FALSE;
  case E_NOT:
    switch (eval_bool_expr (be->subexpr)) {
    case E_TRUE:  return E_FALSE;
    case E_FALSE: return E_TRUE;
    default:      return E_UNKNOWN;
    }
  case E_AND:
    deflt = E_TRUE;
    for (be=be->subexpr; be != NULL; be=be->next)
      switch (eval_bool_expr (be)) {
      case E_FALSE:   return E_FALSE;
      case E_UNKNOWN: deflt = E_UNKNOWN; break;   /* Could still be E_FALSE */
      default: break;
      }
    return deflt;
  case E_OR:
    deflt = E_FALSE;
    for (be=be->subexpr; be != NULL; be=be->next)
      switch (eval_bool_expr (be)) {
      case E_TRUE:    return E_TRUE;
      case E_UNKNOWN: deflt = E_UNKNOWN; break;   /* Could still be E_TRUE */
      default: break;
      }
    return deflt;
  default: return E_UNKNOWN;
  }
}